

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

vector3 * vector3_normalize(vector3 *self)

{
  double dVar1;
  double dVar2;
  
  dVar1 = (self->field_0).v[2] * (self->field_0).v[2] +
          (self->field_0).v[0] * (self->field_0).v[0] + (self->field_0).v[1] * (self->field_0).v[1];
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  dVar2 = -dVar1;
  if (-dVar1 <= dVar1) {
    dVar2 = dVar1;
  }
  if (1e-05 <= dVar2) {
    dVar2 = (self->field_0).v[1];
    (self->field_0).v[0] = (self->field_0).v[0] / dVar1;
    (self->field_0).v[1] = dVar2 / dVar1;
    (self->field_0).v[2] = (self->field_0).v[2] / dVar1;
  }
  return self;
}

Assistant:

HYPAPI struct vector3 *vector3_normalize(struct vector3 *self)
{
	HYP_FLOAT mag;

	mag = vector3_magnitude(self);

	if (scalar_equalsf(mag, 0.0f)) {
		/* can't normalize a zero
		 * avoid divide by zero
		 */
		return self;
	}

	self->x = self->x / mag;
	self->y = self->y / mag;
	self->z = self->z / mag;

	return self;
}